

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
format::string<std::__cxx11::string,char_const[8],unsigned_long_long,unsigned_long_long>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,format *this,char (*fmt) [8],unsigned_long_long *args,unsigned_long_long *args_1)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  append_string<std::__cxx11::string,char_const[8],unsigned_long_long,unsigned_long_long>
            (__return_storage_ptr__,(char (*) [8])this,(unsigned_long_long *)fmt,args);
  return __return_storage_ptr__;
}

Assistant:

StringType string(FormatType& fmt,
                    Args&& ... args) {
    StringType output;
    append_string(output, fmt, std::forward<Args>(args)...);
    return output;
  }